

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::tuple_caster<std::pair,_long,_long>::load
          (tuple_caster<std::pair,_long,_long> *this,handle src,bool convert)

{
  handle obj;
  bool bVar1;
  size_t sVar2;
  byte in_DL;
  tuple_caster<std::pair,_long,_long> *in_RDI;
  sequence seq;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  sequence *in_stack_ffffffffffffffa0;
  undefined1 local_30 [23];
  byte local_19;
  bool local_1;
  
  local_19 = in_DL & 1;
  obj.m_ptr._7_1_ = in_stack_ffffffffffffff97;
  obj.m_ptr._0_7_ = in_stack_ffffffffffffff90;
  bVar1 = isinstance<pybind11::sequence,_0>(obj);
  if (bVar1) {
    reinterpret_borrow<pybind11::sequence>((PyObject *)local_30);
    sVar2 = sequence::size(in_stack_ffffffffffffffa0);
    if (sVar2 == 2) {
      local_1 = tuple_caster<std::pair,long,long>::load_impl<0ul,1ul>(in_RDI,local_30,local_19 & 1);
    }
    else {
      local_1 = false;
    }
    sequence::~sequence((sequence *)0x390ede);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        const auto seq = reinterpret_borrow<sequence>(src);
        if (seq.size() != size)
            return false;
        return load_impl(seq, convert, indices{});
    }